

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_xmlerror(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int test_ret;
  int iVar4;
  int n_ctx;
  uint uVar5;
  bool bVar6;
  int test_ret_1;
  
  if (quiet == '\0') {
    puts("Testing xmlerror : 6 of 17 functions ...");
  }
  iVar4 = 0;
  bVar6 = true;
LAB_00137e27:
  if (bVar6) {
    bVar6 = true;
    while (bVar6) {
      iVar1 = xmlMemBlocks();
      bVar6 = false;
      xmlCopyError(0,0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 == iVar2) goto LAB_00137e27;
      xmlMemBlocks();
      bVar6 = false;
      printf("Leak of %d blocks found in xmlCopyError");
      iVar4 = iVar4 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    bVar6 = false;
    goto LAB_00137e27;
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  for (uVar5 = 0; uVar5 != 2; uVar5 = uVar5 + 1) {
    iVar2 = xmlMemBlocks();
    xmlCtxtResetLastError();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCtxtResetLastError",(ulong)(uint)(iVar3 - iVar2));
      iVar1 = iVar1 + 1;
      printf(" %d",(ulong)uVar5);
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  uVar5 = iVar4 + iVar1;
  bVar6 = true;
  while (bVar6) {
    iVar4 = xmlMemBlocks();
    xmlParserPrintFileContext(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar4 == iVar1) break;
    iVar1 = xmlMemBlocks();
    bVar6 = false;
    printf("Leak of %d blocks found in xmlParserPrintFileContext",(ulong)(uint)(iVar1 - iVar4));
    printf(" %d",0);
    putchar(10);
    uVar5 = uVar5 + 1;
  }
  function_tests = function_tests + 1;
  bVar6 = true;
  while (bVar6) {
    iVar4 = xmlMemBlocks();
    xmlParserPrintFileInfo(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar4 == iVar1) break;
    iVar1 = xmlMemBlocks();
    bVar6 = false;
    printf("Leak of %d blocks found in xmlParserPrintFileInfo",(ulong)(uint)(iVar1 - iVar4));
    printf(" %d",0);
    putchar(10);
    uVar5 = uVar5 + 1;
  }
  function_tests = function_tests + 1;
  bVar6 = true;
  while (bVar6) {
    iVar4 = xmlMemBlocks();
    xmlResetError(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar4 == iVar1) break;
    iVar1 = xmlMemBlocks();
    bVar6 = false;
    printf("Leak of %d blocks found in xmlResetError",(ulong)(uint)(iVar1 - iVar4));
    printf(" %d",0);
    putchar(10);
    uVar5 = uVar5 + 1;
  }
  function_tests = function_tests + 1;
  xmlResetLastError();
  call_tests = call_tests + 1;
  xmlResetLastError();
  function_tests = function_tests + 1;
  if (uVar5 != 0) {
    printf("Module xmlerror: %d errors\n",(ulong)uVar5);
  }
  return uVar5;
}

Assistant:

static int
test_xmlerror(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlerror : 6 of 17 functions ...\n");
    test_ret += test_xmlCopyError();
    test_ret += test_xmlCtxtGetLastError();
    test_ret += test_xmlCtxtResetLastError();
    test_ret += test_xmlFormatError();
    test_ret += test_xmlGetLastError();
    test_ret += test_xmlParserError();
    test_ret += test_xmlParserPrintFileContext();
    test_ret += test_xmlParserPrintFileInfo();
    test_ret += test_xmlParserValidityError();
    test_ret += test_xmlParserValidityWarning();
    test_ret += test_xmlParserWarning();
    test_ret += test_xmlResetError();
    test_ret += test_xmlResetLastError();
    test_ret += test_xmlSetGenericErrorFunc();
    test_ret += test_xmlSetStructuredErrorFunc();
    test_ret += test_xmlThrDefSetGenericErrorFunc();
    test_ret += test_xmlThrDefSetStructuredErrorFunc();

    if (test_ret != 0)
	printf("Module xmlerror: %d errors\n", test_ret);
    return(test_ret);
}